

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::$_0::__0(anon_class_416_2_abd2a4d0 *this)

{
  long in_RDI;
  
  std::vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>::vector
            ((vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_> *)0x106d48);
  std::__cxx11::stringstream::stringstream((stringstream *)(in_RDI + 0x18));
  return;
}

Assistant:

DOCTEST_THREAD_LOCAL class
    {
        std::vector<std::streampos> stack;
        std::stringstream           ss;

    public:
        std::ostream* push() {
            stack.push_back(ss.tellp());
            return &ss;
        }